

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::TensorViewNV::IsSameImpl
          (TensorViewNV *this,Type *that,IsSameCache *param_2)

{
  int iVar1;
  undefined4 extraout_var;
  bool local_39;
  TensorViewNV *tv;
  IsSameCache *param_2_local;
  Type *that_local;
  TensorViewNV *this_local;
  long lVar2;
  
  iVar1 = (*that->_vptr_Type[0x44])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_39 = false;
    if ((*(int *)&(this->super_Type).field_0x24 == *(int *)(lVar2 + 0x24)) &&
       (local_39 = false, this->has_dimensions_id_ == *(uint32_t *)(lVar2 + 0x28))) {
      local_39 = std::operator==(&this->perm_,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (lVar2 + 0x30));
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool TensorViewNV::IsSameImpl(const Type* that, IsSameCache*) const {
  const TensorViewNV* tv = that->AsTensorViewNV();
  if (!tv) return false;
  return dim_id_ == tv->dim_id_ &&
         has_dimensions_id_ == tv->has_dimensions_id_ && perm_ == tv->perm_;
}